

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_update.c
# Opt level: O2

lu_int basiclu_update(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                     lu_int *Wi,double *Wx,double xtbl)

{
  lu_int lVar1;
  undefined4 extraout_EDX;
  int iVar2;
  undefined1 auVar3 [16];
  lu this;
  
  lVar1 = lu_load(&this,istore,xstore,Li,Lx,Ui,Ux,Wi,Wx);
  if (lVar1 == 0) {
    auVar3._0_4_ = -(uint)(Li == (lu_int *)0x0);
    auVar3._4_4_ = -(uint)(Lx == (double *)0x0);
    auVar3._8_4_ = -(uint)(Ui == (lu_int *)0x0);
    auVar3._12_4_ = -(uint)(Ux == (double *)0x0);
    iVar2 = movmskps(extraout_EDX,auVar3);
    if ((Wx == (double *)0x0 || Wi == (lu_int *)0x0) || iVar2 != 0) {
      lVar1 = -3;
    }
    else {
      lVar1 = -2;
      if (((-1 < this.nupdate) && (-1 < this.ftran_for_update)) && (-1 < this.btran_for_update)) {
        lVar1 = lu_update(&this,xtbl);
      }
    }
    lVar1 = lu_save(&this,istore,xstore,lVar1);
  }
  return lVar1;
}

Assistant:

lu_int basiclu_update
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    double xtbl
)
{
    struct lu this;
    lu_int status;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx))
    {
        status = BASICLU_ERROR_argument_missing;
    }
    else if (this.nupdate < 0 || this.ftran_for_update < 0 ||
             this.btran_for_update < 0)
    {
        status = BASICLU_ERROR_invalid_call;
    }
    else
    {
        status = lu_update(&this, xtbl);
    }
    return lu_save(&this, istore, xstore, status);
}